

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vw_exception.cc
# Opt level: O2

void __thiscall VW::vw_exception::vw_exception(vw_exception *this,vw_exception *ex)

{
  *(undefined ***)this = &PTR__vw_exception_002adec0;
  this->file = ex->file;
  std::__cxx11::string::string((string *)&this->message,(string *)&ex->message);
  this->lineNumber = ex->lineNumber;
  return;
}

Assistant:

vw_exception::vw_exception(const vw_exception& ex) : file(ex.file), message(ex.message), lineNumber(ex.lineNumber) {}